

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_sssub32_aarch64(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = desc * 8 & 0xff;
  uVar4 = 0;
  do {
    uVar1 = *(uint *)((long)a + uVar4);
    uVar2 = uVar1 - *(uint *)((long)b + uVar4);
    uVar5 = ((int)uVar2 >> 0x1f) + 0x80000000;
    if (-1 < (int)((uVar2 ^ uVar1) & (*(uint *)((long)b + uVar4) ^ uVar1))) {
      uVar5 = uVar2;
    }
    *(uint *)((long)d + uVar4) = uVar5;
    uVar4 = uVar4 + 4;
  } while (uVar4 < uVar3 + 8);
  if (uVar3 < (desc >> 2 & 0xf8)) {
    helper_gvec_sssub32_aarch64_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_sssub32)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int32_t)) {
        int32_t ai = *(int32_t *)((char *)a + i);
        int32_t bi = *(int32_t *)((char *)b + i);
        int32_t di = ai - bi;
        if (((di ^ ai) & (ai ^ bi)) < 0) {
            /* Signed overflow.  */
            di = (di < 0 ? INT32_MAX : INT32_MIN);
        }
        *(int32_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}